

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetBlend
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint32 uVar1;
  VMValue *pVVar2;
  DFlashFader *this;
  size_t len;
  bool bVar3;
  bool local_5f;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_50;
  int local_4c;
  PalEntry color2;
  int tics;
  double alpha;
  AActor *pAStack_38;
  PalEntry color;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe59,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe59,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAStack_38 = (AActor *)(param->field_0).field_1.a;
  local_5f = true;
  if (pAStack_38 != (AActor *)0x0) {
    local_5f = DObject::IsKindOf((DObject *)pAStack_38,AActor::RegistrationInfo.MyClass);
  }
  if (local_5f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe59,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe5a,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe5a,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  PalEntry::PalEntry((PalEntry *)((long)&alpha + 4));
  alpha._4_4_ = param[1].field_0.i;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe5b,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe5b,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  _color2 = param[2].field_0.field_1.a;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe5c,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe5c,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_4c = param[3].field_0.i;
  PalEntry::PalEntry((PalEntry *)&local_50.field_0);
  if (numparam < 5) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe5d,
                    "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    len = (size_t)(uint)(pVVar2->field_0).i;
    PalEntry::operator=((PalEntry *)&local_50.field_0,(pVVar2->field_0).i);
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe5d,
                    "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    len = (size_t)(uint)param[4].field_0.i;
    PalEntry::operator=((PalEntry *)&local_50.field_0,param[4].field_0.i);
  }
  uVar1 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&alpha + 4));
  if (uVar1 == 0xffffffff) {
    len = 0;
    PalEntry::operator=((PalEntry *)((long)&alpha + 4),0);
  }
  uVar1 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&local_50.field_0);
  if (uVar1 == 0xffffffff) {
    len = 0;
    PalEntry::operator=((PalEntry *)&local_50.field_0,0);
  }
  if (local_50.field_0.a == '\0') {
    local_50.d = alpha._4_4_;
  }
  this = (DFlashFader *)DObject::operator_new((DObject *)0x68,len);
  DFlashFader::DFlashFader
            (this,(float)(alpha._4_4_ >> 0x10 & 0xff) / 255.0,
             (float)(alpha._4_4_ >> 8 & 0xff) / 255.0,(float)(alpha._4_4_ & 0xff) / 255.0,
             (float)(double)_color2,(float)(local_50.d >> 0x10 & 0xff) / 255.0,
             (float)(local_50.d >> 8 & 0xff) / 255.0,(float)(local_50.d & 0xff) / 255.0,0.0,
             (float)local_4c / 35.0,pAStack_38);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetBlend)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_COLOR		(color);
	PARAM_FLOAT		(alpha);
	PARAM_INT		(tics);
	PARAM_COLOR_DEF	(color2);

	if (color == MAKEARGB(255,255,255,255))
		color = 0;
	if (color2 == MAKEARGB(255,255,255,255))
		color2 = 0;
	if (color2.a == 0)
		color2 = color;

	new DFlashFader(color.r/255.f, color.g/255.f, color.b/255.f, float(alpha),
					color2.r/255.f, color2.g/255.f, color2.b/255.f, 0,
					float(tics)/TICRATE, self);
	return 0;
}